

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_upscale::build_graph(test_upscale *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  test_case *in_RSI;
  int64_t *in_RDI;
  ggml_tensor *out;
  ggml_tensor *a;
  undefined8 in_stack_ffffffffffffffe0;
  ggml_context *in_stack_ffffffffffffffe8;
  
  std::array<long,_4UL>::data((array<long,_4UL> *)0x161651);
  pgVar1 = test_case::ggml_new_tensor
                     (in_RSI,in_stack_ffffffffffffffe8,
                      (ggml_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      (int)in_stack_ffffffffffffffe0,in_RDI);
  ggml_set_name(pgVar1,"a");
  if ((*(byte *)((long)in_RDI + 100) & 1) != 0) {
    pgVar1 = (ggml_tensor *)ggml_transpose(in_RSI,pgVar1);
    ggml_set_name(pgVar1,"a_transposed");
  }
  pgVar1 = (ggml_tensor *)ggml_upscale(in_RSI,pgVar1,(int)in_RDI[0xc],(int)in_RDI[0xd]);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(a, "a");

        if (transpose) {
            a = ggml_transpose(ctx, a);
            ggml_set_name(a, "a_transposed");
        }

        ggml_tensor * out = ggml_upscale(ctx, a, scale_factor, mode);
        ggml_set_name(out, "out");

        return out;
    }